

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O2

_InstInfo * inst_lookup_prefixed(_InstNode in,_PrefixState *ps)

{
  uint uVar1;
  bool bVar2;
  uint index;
  uint uVar3;
  _InstInfo *p_Var4;
  
  uVar1 = ps->decodedPrefixes;
  bVar2 = true;
  index = uVar1 & 0x2060;
  if (index == 0) goto LAB_00104744;
  if (index == 0x20) {
LAB_00104738:
    uVar3 = 0xffffffdf;
    index = 3;
  }
  else if (index == 0x40) {
    uVar3 = 0xffffffbf;
    index = 2;
  }
  else if (index == 0x2000) {
    ps->isOpSizeMandatory = 1;
    uVar3 = 0xffffdfff;
    index = 1;
  }
  else {
    if ((~uVar1 & 0x60) == 0) {
      return (_InstInfo *)0x0;
    }
    bVar2 = false;
    if ((uVar1 & 0x20) != 0) goto LAB_00104738;
    if ((uVar1 & 0x40) == 0) {
      index = 0;
      goto LAB_00104744;
    }
    uVar3 = 0xffffff9f;
    index = 2;
  }
  ps->decodedPrefixes = uVar1 & uVar3;
LAB_00104744:
  p_Var4 = inst_get_info(in,index);
  if (bVar2) {
    if (p_Var4 == (_InstInfo *)0x0) {
      p_Var4 = inst_get_info(in,0);
      return p_Var4;
    }
    return p_Var4;
  }
  if (p_Var4 == (_InstInfo *)0x0) {
    return (_InstInfo *)0x0;
  }
  if ((*(byte *)((long)FlagsTable +
                (ulong)InstSharedInfoTable[p_Var4->sharedIndex].flagsIndex * 4 + 1) & 0x20) == 0) {
    return (_InstInfo *)0x0;
  }
  return p_Var4;
}

Assistant:

static _InstInfo* inst_lookup_prefixed(_InstNode in, _PrefixState* ps)
{
	int checkOpSize = FALSE;
	int index = 0;
	_InstInfo* ii = NULL;

	/* Check prefixes of current decoded instruction (None, 0x66, 0xf3, 0xf2). */
	switch (ps->decodedPrefixes & (INST_PRE_OP_SIZE | INST_PRE_REPS))
	{
		case 0:
			/* Non-prefixed, index = 0. */
			index = 0;
		break;
		case INST_PRE_OP_SIZE:
			/* 0x66, index = 1. */
			index = 1;
			/* Mark that we used it as a mandatory prefix. */
			ps->isOpSizeMandatory = TRUE;
			ps->decodedPrefixes &= ~INST_PRE_OP_SIZE;
		break;
		case INST_PRE_REP:
			/* 0xf3, index = 2. */
			index = 2;
			ps->decodedPrefixes &= ~INST_PRE_REP;
		break;
		case INST_PRE_REPNZ:
			/* 0xf2, index = 3. */
			index = 3;
			ps->decodedPrefixes &= ~INST_PRE_REPNZ;
		break;
		default:
			/*
			 * Now we got a problem, since there are a few mandatory prefixes at once.
			 * There is only one case when it's ok, when the operand size prefix is for real (not mandatory).
			 * Otherwise we will have to return NULL, since the instruction is illegal.
			 * Therefore we will start with REPNZ and REP prefixes,
			 * try to get the instruction and only then check for the operand size prefix.
			 */

			 /* If both REPNZ and REP are together, it's illegal for sure. */
			if ((ps->decodedPrefixes & INST_PRE_REPS) == INST_PRE_REPS) return NULL;

			/* Now we know it's either REPNZ+OPSIZE or REP+OPSIZE, so examine the instruction. */
			if (ps->decodedPrefixes & INST_PRE_REPNZ) {
				index = 3;
				ps->decodedPrefixes &= ~INST_PRE_REPNZ;
			}
			else if (ps->decodedPrefixes & INST_PRE_REP) {
				index = 2;
				ps->decodedPrefixes &= ~INST_PRE_REP;
			}
			/* Mark to verify the operand-size prefix of the fetched instruction below. */
			checkOpSize = TRUE;
		break;
	}

	/* Fetch the inst-info from the index. */
	ii = inst_get_info(in, index);

	if (checkOpSize) {
		/* If the instruction doesn't support operand size prefix, then it's illegal. */
		if ((ii == NULL) || (~INST_INFO_FLAGS(ii) & INST_PRE_OP_SIZE)) return NULL;
	}

	/* If there was a prefix, but the instruction wasn't found. Try to fall back to use the normal instruction. */
	if (ii == NULL) ii = inst_get_info(in, 0);
	return ii;
}